

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool ParseCSS1Selector(TidyDocImpl *doc,TidyOptionImpl *option)

{
  Bool BVar1;
  bool bVar2;
  uint local_130;
  uint local_12c;
  uint c;
  uint i;
  char buf [256];
  TidyConfigImpl *cfg;
  TidyOptionImpl *option_local;
  TidyDocImpl *doc_local;
  
  buf._248_8_ = &doc->config;
  memset(&c,0,0x100);
  local_12c = 0;
  if (*(int *)(buf._248_8_ + 0x694) == -1) {
    SetOptionValue(doc,option->id,(ctmbstr)0x0);
    doc_local._4_4_ = yes;
  }
  else {
    local_130 = SkipWhite((TidyConfigImpl *)buf._248_8_);
    while( true ) {
      bVar2 = false;
      if ((local_12c < 0xfe) && (bVar2 = false, local_130 != 0xffffffff)) {
        BVar1 = prvTidyIsWhite(local_130);
        bVar2 = BVar1 == no;
      }
      if (!bVar2) break;
      *(char *)((long)&c + (ulong)local_12c) = (char)local_130;
      local_130 = AdvanceChar(&doc->config);
      local_12c = local_12c + 1;
    }
    *(undefined1 *)((long)&c + (ulong)local_12c) = 0;
    if (local_12c == 0) {
      doc_local._4_4_ = no;
    }
    else {
      BVar1 = prvTidyIsCSS1Selector((ctmbstr)&c);
      if (BVar1 == no) {
        prvTidyReportBadArgument(doc,option->name);
        doc_local._4_4_ = no;
      }
      else {
        *(undefined1 *)((long)&c + (ulong)local_12c) = 0;
        SetOptionValue(doc,option->id,(ctmbstr)&c);
        doc_local._4_4_ = yes;
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

Bool ParseCSS1Selector( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    char buf[256] = {0};
    uint i = 0;
    uint c;

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
    {
        SetOptionValue( doc, option->id, NULL );
        return yes;
    }

    c = SkipWhite( cfg );

    while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) )
    {
        buf[i++] = (tmbchar) c;
        c = AdvanceChar( &doc->config );
    }
    buf[i] = '\0';

    if ( i == 0 ) {
        return no;
    }
    else if ( !TY_(IsCSS1Selector)(buf) ) {
        TY_(ReportBadArgument)( doc, option->name );
        return no;
    }

    buf[i] = 0; /* Is #697 - Do *not* add '-' */
#if 0   /* Is #697 - Is this still required? KEEP HISTORY - DO NOT DELETE */
    buf[i++] = '-';  /* Make sure any escaped Unicode is terminated */
    buf[i] = 0;      /* so valid class names are generated after */
                     /* Tidy appends last digits. */
#endif /* Is #697 - Is this still required? */

    SetOptionValue( doc, option->id, buf );
    return yes;
}